

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

int qpdf_get_num_pages(qpdf_data qpdf)

{
  uint uVar1;
  int iVar2;
  int n;
  int local_2c;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = &local_2c;
  local_2c = -1;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1810:27)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1810:27)>
             ::_M_manager;
  uVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  iVar2 = -1;
  if (uVar1 < 2) {
    iVar2 = local_2c;
  }
  return iVar2;
}

Assistant:

int
qpdf_get_num_pages(qpdf_data qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_num_pages");
    int n = -1;
    QPDF_ERROR_CODE code =
        trap_errors(qpdf, [&n](qpdf_data q) { n = QIntC::to_int(q->qpdf->getAllPages().size()); });
    if (code & QPDF_ERRORS) {
        return -1;
    }
    return n;
}